

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O1

void __thiscall Kernel::KBO::State::traverse<_1,false>(State *this,KBO *kbo,AppliedTerm tt)

{
  uint uVar1;
  uint64_t uVar2;
  SubstApplicator *pSVar3;
  State *pSVar4;
  KboWeight KVar5;
  int iVar6;
  undefined4 extraout_var;
  bool bVar8;
  ulong uVar7;
  
  if (((undefined1  [24])tt & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
    if (traverse<-1,false>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState == '\0') {
      traverse<_1,false>();
    }
    if (traverse<-1,_false>::recState._cursor == traverse<-1,_false>::recState._end) {
      ::Lib::Stack<State>::expand(&traverse<-1,_false>::recState);
    }
    pSVar4 = traverse<-1,_false>::recState._cursor;
    ((traverse<-1,_false>::recState._cursor)->t).applicator = tt.applicator;
    (pSVar4->t).term._content = tt.term._content;
    (pSVar4->t).aboveVar = tt.aboveVar;
    *(undefined7 *)&(pSVar4->t).field_0x9 = tt._9_7_;
    pSVar4->arg = 0;
    traverse<-1,_false>::recState._cursor = traverse<-1,_false>::recState._cursor + 1;
    if ((*(byte *)(tt.term._content + 0x28) & 0x20) == 0) {
      KVar5 = KboWeightMap<Kernel::FuncSigTraits>::symbolWeight
                        (&kbo->_funcWeights,*(uint *)(tt.term._content + 8));
    }
    else {
      KVar5 = (kbo->_funcWeights)._specialWeights._variableWeight;
    }
    this->_weightDiff = this->_weightDiff - KVar5;
    if (traverse<-1,_false>::recState._cursor != traverse<-1,_false>::recState._stack) {
      do {
        pSVar4 = traverse<-1,_false>::recState._cursor;
        uVar1 = traverse<-1,_false>::recState._cursor[-1].arg;
        uVar2 = traverse<-1,_false>::recState._cursor[-1].t.term._content;
        if (uVar1 < (*(uint *)(uVar2 + 0xc) & 0xfffffff)) {
          traverse<-1,_false>::recState._cursor[-1].arg = uVar1 + 1;
          uVar7 = *(ulong *)(uVar2 + 0x28 +
                            ((ulong)(*(uint *)(uVar2 + 0xc) & 0xfffffff) - (long)(int)uVar1) * 8);
          bVar8 = pSVar4[-1].t.aboveVar;
          pSVar3 = pSVar4[-1].t.applicator;
          if (((bVar8 & 1U) != 0) && ((uVar7 & 1) != 0)) {
            iVar6 = (*pSVar3->_vptr_SubstApplicator[2])(pSVar3,uVar7 >> 2 & 0xffffffff);
            uVar7 = CONCAT44(extraout_var,iVar6);
            bVar8 = false;
          }
          if ((uVar7 & 1) == 0) {
            if ((*(byte *)(uVar7 + 0x28) & 0x20) == 0) {
              KVar5 = KboWeightMap<Kernel::FuncSigTraits>::symbolWeight
                                (&kbo->_funcWeights,*(uint *)(uVar7 + 8));
            }
            else {
              KVar5 = (kbo->_funcWeights)._specialWeights._variableWeight;
            }
            this->_weightDiff = this->_weightDiff - KVar5;
            if (traverse<-1,_false>::recState._cursor == traverse<-1,_false>::recState._end) {
              ::Lib::Stack<State>::expand(&traverse<-1,_false>::recState);
            }
            pSVar4 = traverse<-1,_false>::recState._cursor;
            ((traverse<-1,_false>::recState._cursor)->t).term._content = uVar7;
            (pSVar4->t).aboveVar = bVar8;
            (pSVar4->t).applicator = pSVar3;
            pSVar4->arg = 0;
            traverse<-1,_false>::recState._cursor = traverse<-1,_false>::recState._cursor + 1;
          }
          else {
            this->_weightDiff =
                 this->_weightDiff - (kbo->_funcWeights)._specialWeights._variableWeight;
            recordVariable<_1>(this,(uint)(uVar7 >> 2));
          }
        }
        else {
          traverse<-1,_false>::recState._cursor = traverse<-1,_false>::recState._cursor + -1;
        }
      } while (traverse<-1,_false>::recState._cursor != traverse<-1,_false>::recState._stack);
    }
    return;
  }
  this->_weightDiff = this->_weightDiff - (kbo->_funcWeights)._specialWeights._variableWeight;
  recordVariable<_1>(this,(uint)(tt.term._content >> 2));
  return;
}

Assistant:

void KBO::State::traverse(KBO const& kbo, AppliedTerm tt)
{
  static_assert(coef==1 || coef==-1);

  if (tt.term.isVar()) {
    if constexpr (!varsOnly) {
      _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
    }
    recordVariable<coef>(tt.term.var());
    return;
  }
  struct State {
    AppliedTerm t;
    unsigned arg;
  };
  static Stack<State> recState;
  recState.push(State{ tt, 0 });

  if constexpr (!varsOnly) {
    _weightDiff += kbo.symbolWeight(tt.term.term()) * coef;
  }

  while (recState.isNonEmpty()) {
    auto& curr = recState.top();
    if (curr.arg >= curr.t.term.term()->arity()) {
      recState.pop();
      continue;
    }
    AppliedTerm t(*curr.t.term.term()->nthArgument(curr.arg++), curr.t);
    if (t.term.isVar()) {
      ASS(!t.aboveVar);
      if constexpr (!varsOnly) {
        _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
      }
      recordVariable<coef>(t.term.var());
      continue;
    }

    if constexpr (varsOnly) {
      if (!t.term.term()->ground()) {
        recState.push(State{ t, 0 });
      }
    } else {
      _weightDiff += kbo.symbolWeight(t.term.term()) * coef;
      recState.push(State{ t, 0 });
    }
  }
}